

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_dirty_update_free(filemgr *file)

{
  filemgr_dirty_update_node *in_RDI;
  filemgr_dirty_update_node *node;
  avl_node *a;
  avl_node *in_stack_00000018;
  avl_tree *in_stack_00000020;
  avl_node *local_10;
  
  local_10 = avl_first((avl_tree *)&in_RDI[8].seqtree_root);
  while (local_10 != (avl_node *)0x0) {
    local_10 = avl_next(local_10);
    avl_remove(in_stack_00000020,in_stack_00000018);
    _filemgr_dirty_update_remove_node((filemgr *)node,in_RDI);
  }
  pthread_spin_destroy((pthread_spinlock_t *)(in_RDI + 9));
  return;
}

Assistant:

void filemgr_dirty_update_free(struct filemgr *file)
{
    struct avl_node *a = avl_first(&file->dirty_update_idx);
    struct filemgr_dirty_update_node *node;

    while (a) {
        node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        a = avl_next(a);
        avl_remove(&file->dirty_update_idx, &node->avl);
        _filemgr_dirty_update_remove_node(file, node);
    }
    spin_destroy(&file->dirty_update_lock);
}